

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::GLSL420Pack::LineContinuationTest::useSourceLengths(LineContinuationTest *this)

{
  uint uVar1;
  bool local_11;
  bool result;
  LineContinuationTest *this_local;
  
  uVar1 = (this->m_test_case).m_case;
  if ((uVar1 < 10) || ((uVar1 != 10 && ((uVar1 - 0xb < 2 || (1 < uVar1 - 0xd)))))) {
    local_11 = false;
  }
  else {
    local_11 = true;
  }
  return local_11;
}

Assistant:

bool LineContinuationTest::useSourceLengths() const
{
	bool result;

	switch (m_test_case.m_case)
	{
	case ASSIGNMENT_BEFORE_OPERATOR:
	case ASSIGNMENT_AFTER_OPERATOR:
	case VECTOR_VARIABLE_INITIALIZER:
	case TOKEN_INSIDE_FUNCTION_NAME:
	case TOKEN_INSIDE_TYPE_NAME:
	case TOKEN_INSIDE_VARIABLE_NAME:
	case PREPROCESSOR_TOKEN_INSIDE:
	case PREPROCESSOR_TOKEN_BETWEEN:
	case COMMENT:
	case SOURCE_TERMINATION_NULL:
	case PART_TERMINATION_NULL:
	case PART_NEXT_TO_TERMINATION_NULL:
	default:
		result = false;
		break;
	case SOURCE_TERMINATION_NON_NULL:
	case PART_TERMINATION_NON_NULL:
	case PART_NEXT_TO_TERMINATION_NON_NULL:
		result = true;
		break;
	};

	return result;
}